

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.h
# Opt level: O1

DiagnosticStream * __thiscall
spvtools::AssemblyContext::diagnostic
          (DiagnosticStream *__return_storage_ptr__,AssemblyContext *this,spv_result_t error)

{
  spv_position_t position;
  string local_48;
  
  position = this->current_position_;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position,&this->consumer_,&local_48,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

DiagnosticStream diagnostic(spv_result_t error) {
    return DiagnosticStream(current_position_, consumer_, "", error);
  }